

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentSpecNode.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::ContentSpecNode::serialize(ContentSpecNode *this,XSerializeEngine *serEng)

{
  undefined8 in_RAX;
  QName *pQVar1;
  XMLElementDecl *pXVar2;
  ContentSpecNode *pCVar3;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int type;
  NodeTypes local_24;
  
  local_24 = (NodeTypes)((ulong)in_RAX >> 0x20);
  if (serEng->fStoreLoad != 0) {
    pQVar1 = (QName *)XSerializeEngine::read(serEng,0x4250b0,in_RDX,in_RCX);
    this->fElement = pQVar1;
    pXVar2 = XMLElementDecl::loadElementDecl(serEng);
    this->fElementDecl = pXVar2;
    pCVar3 = (ContentSpecNode *)XSerializeEngine::read(serEng,0x445788,__buf,in_RCX);
    this->fFirst = pCVar3;
    pCVar3 = (ContentSpecNode *)XSerializeEngine::read(serEng,0x445788,__buf_00,in_RCX);
    this->fSecond = pCVar3;
    XSerializeEngine::operator>>(serEng,&local_24);
    this->fType = local_24;
    XSerializeEngine::operator>>(serEng,&this->fAdoptFirst);
    XSerializeEngine::operator>>(serEng,&this->fAdoptSecond);
    XSerializeEngine::operator>>(serEng,&this->fMinOccurs);
    XSerializeEngine::operator>>(serEng,&this->fMaxOccurs);
    return;
  }
  XSerializeEngine::write(serEng,(int)this->fElement,in_RDX,in_RCX);
  XMLElementDecl::storeElementDecl(serEng,this->fElementDecl);
  XSerializeEngine::write(serEng,(int)this->fFirst,__buf_01,in_RCX);
  XSerializeEngine::write(serEng,(int)this->fSecond,__buf_02,in_RCX);
  XSerializeEngine::operator<<(serEng,this->fType);
  XSerializeEngine::operator<<(serEng,this->fAdoptFirst);
  XSerializeEngine::operator<<(serEng,this->fAdoptSecond);
  XSerializeEngine::operator<<(serEng,this->fMinOccurs);
  XSerializeEngine::operator<<(serEng,this->fMaxOccurs);
  return;
}

Assistant:

void ContentSpecNode::serialize(XSerializeEngine& serEng)
{
    /***
     *  Since fElement, fFirst, fSecond are NOT created by the default 
     *  constructor, we need to create them dynamically.
     ***/

    if (serEng.isStoring())
    {
        serEng<<fElement;
        XMLElementDecl::storeElementDecl(serEng, fElementDecl);
        serEng<<fFirst;
        serEng<<fSecond;

        serEng<<(int)fType;
        serEng<<fAdoptFirst;
        serEng<<fAdoptSecond;
        serEng<<fMinOccurs;
        serEng<<fMaxOccurs;
    }
    else
    {
        serEng>>fElement;
        fElementDecl = XMLElementDecl::loadElementDecl(serEng);
        serEng>>fFirst;
        serEng>>fSecond;

        int type;
        serEng>>type;
        fType = (NodeTypes)type;

        serEng>>fAdoptFirst;
        serEng>>fAdoptSecond;
        serEng>>fMinOccurs;
        serEng>>fMaxOccurs;
    }

}